

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O0

void jinit_c_master_control(j_compress_ptr cinfo,boolean transcode_only)

{
  undefined8 *puVar1;
  int in_ESI;
  long in_RDI;
  my_master_ptr master;
  boolean in_stack_0000001c;
  j_compress_ptr in_stack_00000020;
  j_compress_ptr in_stack_00000a50;
  undefined4 in_stack_fffffffffffffff0;
  
  puVar1 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x30);
  *(undefined8 **)(in_RDI + 0x1f0) = puVar1;
  *puVar1 = prepare_for_pass;
  puVar1[1] = pass_startup;
  puVar1[2] = finish_pass_master;
  *(undefined4 *)((long)puVar1 + 0x1c) = 0;
  initial_setup(in_stack_00000020,in_stack_0000001c);
  if (*(long *)(in_RDI + 0x118) == 0) {
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x110) = 1;
  }
  else {
    validate_script(in_stack_00000a50);
    if (*(int *)(in_RDI + 0x1dc) < 8) {
      reduce_script((j_compress_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
  }
  if (((*(int *)(in_RDI + 0x158) != 0) || (*(int *)(in_RDI + 0x1dc) < 8)) &&
     (*(int *)(in_RDI + 0x124) == 0)) {
    *(undefined4 *)(in_RDI + 0x128) = 1;
  }
  if (in_ESI == 0) {
    *(undefined4 *)(puVar1 + 4) = 0;
  }
  else if (*(int *)(in_RDI + 0x128) == 0) {
    *(undefined4 *)(puVar1 + 4) = 2;
  }
  else {
    *(undefined4 *)(puVar1 + 4) = 1;
  }
  *(undefined4 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)((long)puVar1 + 0x24) = 0;
  if (*(int *)(in_RDI + 0x128) == 0) {
    *(undefined4 *)(puVar1 + 5) = *(undefined4 *)(in_RDI + 0x110);
  }
  else {
    *(int *)(puVar1 + 5) = *(int *)(in_RDI + 0x110) << 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_c_master_control (j_compress_ptr cinfo, boolean transcode_only)
{
  my_master_ptr master;

  master = (my_master_ptr)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(my_comp_master));
  cinfo->master = (struct jpeg_comp_master *) master;
  master->pub.prepare_for_pass = prepare_for_pass;
  master->pub.pass_startup = pass_startup;
  master->pub.finish_pass = finish_pass_master;
  master->pub.is_last_pass = FALSE;

  /* Validate parameters, determine derived values */
  initial_setup(cinfo, transcode_only);

  if (cinfo->scan_info != NULL) {
#ifdef C_MULTISCAN_FILES_SUPPORTED
    validate_script(cinfo);
    if (cinfo->block_size < DCTSIZE)
      reduce_script(cinfo);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    cinfo->progressive_mode = FALSE;
    cinfo->num_scans = 1;
  }

  if ((cinfo->progressive_mode || cinfo->block_size < DCTSIZE) &&
      !cinfo->arith_code)			/*  TEMPORARY HACK ??? */
    /* assume default tables no good for progressive or downscale mode */
    cinfo->optimize_coding = TRUE;

  /* Initialize my private state */
  if (transcode_only) {
    /* no main pass in transcoding */
    if (cinfo->optimize_coding)
      master->pass_type = huff_opt_pass;
    else
      master->pass_type = output_pass;
  } else {
    /* for normal compression, first pass is always this type: */
    master->pass_type = main_pass;
  }
  master->scan_number = 0;
  master->pass_number = 0;
  if (cinfo->optimize_coding)
    master->total_passes = cinfo->num_scans * 2;
  else
    master->total_passes = cinfo->num_scans;
}